

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O0

nametree_entry_t * nametree_find_or_insert_try(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  ushort uVar1;
  ulong uVar2;
  size_t local_60;
  ulong local_58;
  size_t offset;
  size_t eqiv_component_len;
  size_t component_len;
  int local_38;
  int new_node_number;
  int tmp;
  int father;
  int last_node;
  int now_node;
  size_t len_local;
  uint8_t *name_local;
  ndn_nametree_t *nametree_local;
  
  new_node_number = 0;
  if (len < 2) {
    nametree_local = (ndn_nametree_t *)0x0;
  }
  else {
    if (name[1] < 0xfd) {
      local_58 = 2;
    }
    else {
      local_58 = 4;
    }
    for (; local_58 < len; local_58 = uVar2 + local_58) {
      uVar2 = (ulong)(int)(name[local_58 + 1] + 2);
      local_60 = uVar2;
      if (0x23 < uVar2) {
        local_60 = 0x24;
      }
      uVar1 = *(ushort *)(nametree + (long)new_node_number * 0x2e + 0x26);
      tmp = 0xffff;
      local_38 = -2;
      while ((father = (int)uVar1, father != 0xffff &&
             (local_38 = memcmp(name + local_58,nametree + (long)father * 0x2e,local_60),
             0 < local_38))) {
        tmp = father;
        uVar1 = *(ushort *)(nametree + (long)father * 0x2e + 0x28);
      }
      if (local_38 != 0) {
        father = nametree_create_node(nametree,name + local_58,local_60);
        if (father == 0xffff) {
          return (nametree_entry_t *)0x0;
        }
        if (tmp == 0xffff) {
          *(short *)(nametree + (long)new_node_number * 0x2e + 0x26) = (short)father;
        }
        else {
          *(short *)(nametree + (long)tmp * 0x2e + 0x28) = (short)father;
        }
        *(ushort *)(nametree + (long)father * 0x2e + 0x28) = uVar1;
      }
      new_node_number = father;
    }
    nametree_local = nametree + (long)new_node_number * 0x2e;
  }
  return (nametree_entry_t *)nametree_local;
}

Assistant:

static nametree_entry_t*
nametree_find_or_insert_try(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, last_node, father = 0 , tmp , new_node_number;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    last_node = NDN_INVALID_ID;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      last_node = now_node;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      new_node_number = nametree_create_node(nametree, name + offset , eqiv_component_len);
      if (new_node_number == NDN_INVALID_ID) return NULL;
      if(last_node == NDN_INVALID_ID){
        (*nametree)[father].left_child = new_node_number;
      }else{
        (*nametree)[last_node].right_bro = new_node_number;
      }
      (*nametree)[new_node_number].right_bro = now_node;
      now_node = new_node_number;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}